

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_algorithm.cpp
# Opt level: O0

void try_list_remove(void)

{
  iterator iVar1;
  void *pvVar2;
  iterator __last;
  iterator local_f8;
  const_iterator local_f0;
  const_iterator local_e8;
  _List_node_base *local_e0;
  _List_iterator<int> local_d8;
  int local_cc;
  _List_node_base *local_c8;
  _List_iterator<int> local_c0;
  _List_node_base *local_b8;
  _List_iterator<int> local_b0;
  iterator last;
  char local_94 [4];
  _List_node_base *local_90;
  _List_iterator<int> local_88;
  undefined1 local_80 [8];
  list<int,_std::allocator<int>_> lb;
  allocator<int> local_51;
  undefined1 local_50 [8];
  list<int,_std::allocator<int>_> la;
  int arr [10];
  int LIMIT;
  
  arr[9] = 10;
  arr[2] = 9;
  arr[3] = 8;
  arr[4] = 6;
  arr[5] = 4;
  la.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0x300000001;
  arr[0] = 5;
  arr[1] = 7;
  arr[6] = 2;
  arr[7] = 0;
  std::allocator<int>::allocator(&local_51);
  std::__cxx11::list<int,std::allocator<int>>::list<int*,void>
            ((list<int,std::allocator<int>> *)local_50,
             (int *)&la.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size,arr + 8,
             &local_51);
  std::allocator<int>::~allocator(&local_51);
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)local_80,(list<int,_std::allocator<int>_> *)local_50
            );
  std::operator<<((ostream *)&std::cout,"Original list:\nla:\t");
  local_88._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::begin
                 ((list<int,_std::allocator<int>_> *)local_50);
  local_90 = (_List_node_base *)
             std::__cxx11::list<int,_std::allocator<int>_>::end
                       ((list<int,_std::allocator<int>_> *)local_50);
  __std__for_each<std::_List_iterator<int>,void(*)(int)>_std___List_iterator<int>_std___List_iterator<int>_void____int___
            (local_88,(_List_iterator<int>)local_90,showInt);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  local_94[0] = '\x04';
  local_94[1] = '\0';
  local_94[2] = '\0';
  local_94[3] = '\0';
  std::__cxx11::list<int,_std::allocator<int>_>::remove
            ((list<int,_std::allocator<int>_> *)local_50,local_94);
  std::operator<<((ostream *)&std::cout,"After remove through member function remove():\n");
  std::operator<<((ostream *)&std::cout,"la:\t");
  iVar1 = std::__cxx11::list<int,_std::allocator<int>_>::begin
                    ((list<int,_std::allocator<int>_> *)local_50);
  last = std::__cxx11::list<int,_std::allocator<int>_>::end
                   ((list<int,_std::allocator<int>_> *)local_50);
  __std__for_each<std::_List_iterator<int>,void(*)(int)>_std___List_iterator<int>_std___List_iterator<int>_void____int___
            ((_List_iterator<int>)iVar1._M_node,(_List_iterator<int>)last._M_node,showInt);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::_List_iterator<int>::_List_iterator(&local_b0);
  local_c0._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::begin
                 ((list<int,_std::allocator<int>_> *)local_80);
  local_c8 = (_List_node_base *)
             std::__cxx11::list<int,_std::allocator<int>_>::end
                       ((list<int,_std::allocator<int>_> *)local_80);
  local_cc = 1;
  local_b8 = (_List_node_base *)
             std::remove<std::_List_iterator<int>,int>
                       (local_c0,(_List_iterator<int>)local_c8,&local_cc);
  local_b0 = (_List_iterator<int>)local_b8;
  std::operator<<((ostream *)&std::cout,"After remove through STL function remove():\n");
  std::operator<<((ostream *)&std::cout,"lb:\t");
  local_d8._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::begin
                 ((list<int,_std::allocator<int>_> *)local_80);
  local_e0 = (_List_node_base *)
             std::__cxx11::list<int,_std::allocator<int>_>::end
                       ((list<int,_std::allocator<int>_> *)local_80);
  __std__for_each<std::_List_iterator<int>,void(*)(int)>_std___List_iterator<int>_std___List_iterator<int>_void____int___
            (local_d8,(_List_iterator<int>)local_e0,showInt);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::_List_const_iterator<int>::_List_const_iterator(&local_e8,&local_b0);
  local_f8._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::end
                 ((list<int,_std::allocator<int>_> *)local_80);
  std::_List_const_iterator<int>::_List_const_iterator(&local_f0,&local_f8);
  std::__cxx11::list<int,_std::allocator<int>_>::erase
            ((list<int,_std::allocator<int>_> *)local_80,local_e8,local_f0);
  std::operator<<((ostream *)&std::cout,"After erase:\n");
  std::operator<<((ostream *)&std::cout,"lb:\t");
  iVar1 = std::__cxx11::list<int,_std::allocator<int>_>::begin
                    ((list<int,_std::allocator<int>_> *)local_80);
  __last = std::__cxx11::list<int,_std::allocator<int>_>::end
                     ((list<int,_std::allocator<int>_> *)local_80);
  __std__for_each<std::_List_iterator<int>,void(*)(int)>_std___List_iterator<int>_std___List_iterator<int>_void____int___
            ((_List_iterator<int>)iVar1._M_node,(_List_iterator<int>)__last._M_node,showInt);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::list<int,_std::allocator<int>_>::~list((list<int,_std::allocator<int>_> *)local_80);
  std::__cxx11::list<int,_std::allocator<int>_>::~list((list<int,_std::allocator<int>_> *)local_50);
  return;
}

Assistant:

void try_list_remove()  {
    using namespace std;

    const int LIMIT = 10;
    int arr[LIMIT] = {1, 3, 5, 7, 9, 8, 6, 4, 2, 0};
    list<int> la(arr, arr + LIMIT);
    list<int> lb(la);

    cout << "Original list:\nla:\t";
    for_each(la.begin(), la.end(), showInt);
    cout << endl;

    //  member function will adjust size automatically
    la.remove(4);
    cout << "After remove through member function remove():\n";
    cout << "la:\t";
    for_each(la.begin(), la.end(), showInt);
    cout << endl << endl;

    list<int>::iterator last;
    //  STL remove won't adjust size
    //  FIXME: seems remove 0 not working?
    last = remove(lb.begin(), lb.end(), 1);
    cout << "After remove through STL function remove():\n";
    cout << "lb:\t";
    for_each(lb.begin(), lb.end(), showInt);
    cout << endl << endl;

    //  delete a range
    lb.erase(last, lb.end());
    cout << "After erase:\n";
    cout << "lb:\t";
    for_each(lb.begin(), lb.end(), showInt);
    cout << endl << endl;
}